

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

size_t uc_context_size(uc_engine *uc)

{
  uc_err uVar1;
  size_t sVar2;
  int __init_ret;
  uc_engine *uc_local;
  
  if ((((uc->init_done ^ 0xffU) & 1) == 0) || (uVar1 = uc_init_engine(uc), uVar1 == UC_ERR_OK)) {
    if (uc->context_size == (uc_context_size_t)0x0) {
      uc_local = (uc_engine *)((long)uc->cpu_context_size + 0x18);
    }
    else {
      sVar2 = (*uc->context_size)(uc);
      uc_local = (uc_engine *)(sVar2 + 0x18);
    }
  }
  else {
    uc_local = (uc_engine *)(long)(int)uVar1;
  }
  return (size_t)uc_local;
}

Assistant:

UNICORN_EXPORT
size_t uc_context_size(uc_engine *uc)
{
    UC_INIT(uc);

    if (!uc->context_size) {
        // return the total size of struct uc_context
        return sizeof(uc_context) + uc->cpu_context_size;
    } else {
        return sizeof(uc_context) + uc->context_size(uc);
    }
}